

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

ostream * Eigen::operator<<(ostream *s,DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *m)

{
  ostream *poVar1;
  allocator<char> local_1de;
  allocator<char> local_1dd;
  allocator<char> local_1dc;
  allocator<char> local_1db;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  IOFormat local_118;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198," ",&local_1d9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"\n",&local_1da);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"",&local_1db);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"",&local_1dc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"",&local_1dd);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"",&local_1de);
  IOFormat::IOFormat(&local_118,-1,0,&local_198,&local_1b8,&local_1d8,&local_138,&local_158,
                     &local_178,' ');
  poVar1 = internal::print_matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
                     (s,(Matrix<double,__1,_1,_0,__1,_1> *)m,&local_118);
  IOFormat::~IOFormat(&local_118);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  return poVar1;
}

Assistant:

std::ostream & operator <<
(std::ostream & s,
 const DenseBase<Derived> & m)
{
  return internal::print_matrix(s, m.eval(), EIGEN_DEFAULT_IO_FORMAT);
}